

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_update_pfx_table(rtr_socket *rtr_socket,pfx_table *pfx_table,void *pdu)

{
  byte bVar1;
  int iVar2;
  pdu_error_type error;
  int iVar3;
  uint32_t erroneous_pdu_len;
  long in_FS_OFFSET;
  char txt [30];
  pfx_record pfxr;
  char local_98 [56];
  pfx_record local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    builtin_strncpy(local_98 + 0x10,"G ROA OBJECTS",0xe);
    builtin_strncpy(local_98,"IGNORING INCOMIN",0x10);
    iVar3 = 0;
    lrtr_dbg("RTR Socket: %s");
    goto LAB_0010b4c2;
  }
  bVar1 = *(byte *)((long)pdu + 1);
  if ((bVar1 | 2) != 6) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x3b9,
                  "int rtr_update_pfx_table(struct rtr_socket *, struct pfx_table *, const void *)")
    ;
  }
  erroneous_pdu_len = 0x20;
  if (bVar1 == 4) {
    erroneous_pdu_len = 0x14;
  }
  rtr_prefix_pdu_2_pfx_record(rtr_socket,pdu,&local_60,(uint)bVar1);
  if (*(char *)((long)pdu + 8) == '\0') {
    iVar2 = pfx_table_remove(pfx_table,&local_60);
LAB_0010b3ad:
    if (iVar2 == -3) {
      lrtr_dbg("RTR Socket: Withdrawal of unknown record");
      error = WITHDRAWAL_OF_UNKNOWN_RECORD;
LAB_0010b4a5:
      rtr_send_error_pdu_from_host(rtr_socket,pdu,erroneous_pdu_len,error,(char *)0x0,0);
    }
    else {
      if (iVar2 != -1) {
        iVar3 = 0;
        if (iVar2 != -2) goto LAB_0010b4c2;
        lrtr_ip_addr_to_str(&local_60.prefix,local_98,0x2e);
        lrtr_dbg("RTR Socket: Duplicate Announcement for record: %s/%u-%u, ASN: %u, received",
                 local_98,(ulong)local_60.min_len,(ulong)local_60.max_len);
        error = DUPLICATE_ANNOUNCEMENT;
        goto LAB_0010b4a5;
      }
      builtin_strncpy(local_98,"PFX_TABLE Error",0x10);
      lrtr_dbg("RTR Socket: %s");
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
  }
  else {
    if (*(char *)((long)pdu + 8) == '\x01') {
      iVar2 = pfx_table_add(pfx_table,&local_60);
      goto LAB_0010b3ad;
    }
    builtin_strncpy(local_98 + 0x20,"lue received",0xd);
    builtin_strncpy(local_98 + 0x10,"invalid flags va",0x10);
    builtin_strncpy(local_98,"Prefix PDU with ",0x10);
    lrtr_dbg("RTR Socket: %s",local_98);
    rtr_send_error_pdu_from_host(rtr_socket,pdu,erroneous_pdu_len,CORRUPT_DATA,local_98,0x2d);
  }
  iVar3 = -1;
LAB_0010b4c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_update_pfx_table(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table, const void *pdu)
{
	// the prefix table was not initialized, hence we ignore incoming ROA Objects
	if (pfx_table == NULL) {
		const char txt[] = "IGNORING INCOMING ROA OBJECTS";
		RTR_DBG("%s", txt);
		return RTR_SUCCESS;
	}

	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);

	struct pfx_record pfxr;
	size_t pdu_size = (type == IPV4_PREFIX ? sizeof(struct pdu_ipv4) : sizeof(struct pdu_ipv6));

	rtr_prefix_pdu_2_pfx_record(rtr_socket, pdu, &pfxr, type);

	int rtval;

	if (((struct pdu_ipv4 *)pdu)->flags == 1) { // add record
		rtval = pfx_table_add(pfx_table, &pfxr);
	} else if (((struct pdu_ipv4 *)pdu)->flags == 0) { // remove record
		rtval = pfx_table_remove(pfx_table, &pfxr);
	} else {
		const char txt[] = "Prefix PDU with invalid flags value received";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, CORRUPT_DATA, txt, sizeof(txt));
		return RTR_ERROR;
	}

	if (rtval == PFX_DUPLICATE_RECORD) {
		char ip[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&(pfxr.prefix), ip, INET6_ADDRSTRLEN);
		RTR_DBG("Duplicate Announcement for record: %s/%u-%u, ASN: %u, received", ip, pfxr.min_len,
			pfxr.max_len, pfxr.asn);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, DUPLICATE_ANNOUNCEMENT, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_RECORD_NOT_FOUND) {
		RTR_DBG1("Withdrawal of unknown record");
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, WITHDRAWAL_OF_UNKNOWN_RECORD, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_ERROR) {
		const char txt[] = "PFX_TABLE Error";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	return RTR_SUCCESS;
}